

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall MXNetNode::attr_ai(MXNetNode *this,char *key)

{
  bool bVar1;
  int iVar2;
  const_iterator __x;
  const_iterator key_00;
  long lVar3;
  char *in_RDX;
  vector<int,_std::allocator<int>_> *in_RDI;
  int nscan;
  int nconsumed;
  int c;
  int i;
  const_iterator it;
  vector<int,_std::allocator<int>_> *list;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uVar4;
  vector<int,_std::allocator<int>_> *this_00;
  int local_7c;
  int local_78;
  int local_74;
  undefined4 local_70 [2];
  int local_68;
  undefined1 local_61;
  MXNetNode *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  MXNetNode *in_stack_ffffffffffffffb8;
  string local_40 [32];
  _Self local_20 [4];
  
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RDX,(allocator *)&stack0xffffffffffffffbf);
  __x = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::find(in_stack_ffffffffffffff38,(key_type *)0x118bcc);
  local_20[0]._M_node = __x._M_node;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  key_00 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator==(local_20,(_Self *)&stack0xffffffffffffffa0);
  if (bVar1) {
    memset(this_00,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x118c40);
  }
  else {
    local_61 = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x118c91);
    bVar1 = is_attr_scalar(in_stack_ffffffffffffffa8,(char *)key_00._M_node);
    uVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff44);
    if (bVar1) {
      local_68 = attr_i(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar4,local_68),
                 (value_type_conflict *)in_stack_ffffffffffffff38);
    }
    else {
      local_70[0] = 0;
      local_74 = 0;
      local_78 = 0;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x118d38);
      lVar3 = std::__cxx11::string::c_str();
      local_7c = __isoc99_sscanf(lVar3 + local_74,"%*[\\[(,]%d%n",local_70,&local_78);
      if (local_7c != 1) {
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x118d7f);
        lVar3 = std::__cxx11::string::c_str();
        iVar2 = strncmp((char *)(lVar3 + local_74),"(None",5);
        if (iVar2 == 0) {
          local_70[0] = 0xffffff17;
          local_78 = 5;
          local_7c = 1;
        }
      }
      while (local_7c == 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (this_00,(value_type_conflict *)__x._M_node);
        local_70[0] = 0;
        local_74 = local_78 + local_74;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x118e05);
        lVar3 = std::__cxx11::string::c_str();
        local_7c = __isoc99_sscanf(lVar3 + local_74,"%*[(,]%d%n",local_70,&local_78);
        if (local_7c != 1) {
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x118e4c);
          lVar3 = std::__cxx11::string::c_str();
          iVar2 = strncmp((char *)(lVar3 + local_74),", None",6);
          if (iVar2 == 0) {
            local_70[0] = 0xffffff17;
            local_78 = 6;
            local_7c = 1;
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<int> MXNetNode::attr_ai(const char* key) const
{
    const std::map<std::string, std::string>::const_iterator it = attrs.find(key);
    if (it == attrs.end())
        return std::vector<int>();

    // (1,2,3)
    std::vector<int> list;

    if (is_attr_scalar(key))
    {
        list.push_back(attr_i(key));
        return list;
    }

    int i = 0;
    int c = 0;
    int nconsumed = 0;
    int nscan = sscanf(it->second.c_str() + c, "%*[\\[(,]%d%n", &i, &nconsumed);
    if (nscan != 1)
    {
        // (None
        if (strncmp(it->second.c_str() + c, "(None", 5) == 0)
        {
            i = -233;
            nconsumed = 5;
            nscan = 1;
        }
    }
    while (nscan == 1)
    {
        list.push_back(i);
        //         fprintf(stderr, "%d\n", i);

        i = 0;
        c += nconsumed;
        nscan = sscanf(it->second.c_str() + c, "%*[(,]%d%n", &i, &nconsumed);
        if (nscan != 1)
        {
            // , None
            if (strncmp(it->second.c_str() + c, ", None", 6) == 0)
            {
                i = -233;
                nconsumed = 6;
                nscan = 1;
            }
        }
    }

    return list;
}